

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O2

void __thiscall w3Module::read_section(w3Module *this,uint8_t **cursor)

{
  uint8_t *puVar1;
  byte bVar2;
  uint32_t uVar3;
  code *pcVar4;
  uint uVar5;
  ulong uVar6;
  uint8_t *local_68;
  size_t local_60;
  string local_58;
  uint8_t *local_38;
  
  puVar1 = *cursor;
  bVar2 = read_varuint7(this,cursor);
  if (0xb < bVar2) {
    StringFormat_abi_cxx11_
              (&local_58,"malformed line:%d id:%X payload:%p base:%p end:%p",0x296,
               (ulong)(uint)bVar2,puVar1,this->base,this->end);
    ThrowString(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  printf("%s(%d) read_section offset:%lX\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x298,
         (long)*cursor - (long)this->base);
  uVar3 = read_varuint32(this,cursor);
  uVar6 = (ulong)uVar3;
  printf("%s payload_size:%lX\n","read_section",uVar6);
  puVar1 = *cursor;
  uVar5 = (uint)bVar2;
  local_38 = puVar1;
  if (bVar2 == 0) {
    uVar3 = read_varuint32(this,cursor);
    local_60 = (size_t)uVar3;
    local_68 = *cursor;
    if (this->end < local_68 + uVar3) {
      StringFormat_abi_cxx11_(&local_58,"malformed %d",0x2a4);
      ThrowString(&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  else {
    local_60 = 0;
    local_68 = (uint8_t *)0x0;
  }
  if (this->end < puVar1 + uVar6) {
    StringFormat_abi_cxx11_
              (&local_58,"malformed line:%d id:%X payload:%p payload_size:%lX base:%p end:%p",0x2a7,
               (ulong)uVar5,puVar1,uVar6,this->base,this->end);
    ThrowString(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  printf("%s(%d) read_section offset:%lX\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x2a9,
         (long)*cursor - (long)this->base);
  *cursor = puVar1 + uVar6;
  if (uVar5 == 0) {
    if ((uint)local_60 < 0x7fffffff) {
      printf("skipping custom section:.%.*s\n",local_60,local_68);
    }
  }
  else {
    printf("%s(%d)\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x2b5
          );
    this->sections[uVar5].id = uVar5;
    this->sections[uVar5].name.data = (PCH)local_68;
    this->sections[uVar5].name.size = local_60;
    this->sections[uVar5].payload_size = uVar6;
    this->sections[uVar5].payload = puVar1;
    printf("%s(%d) %d\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x2be
           ,(ulong)uVar5);
    pcVar4 = (code *)section_traits[uVar5].read;
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + (long)this->_vptr_w3Module + -1);
    }
    (*pcVar4)(this,&local_38);
    if (local_38 != *cursor) {
      StringFormat_abi_cxx11_
                (&local_58,"failed to read section:%X payload:%p cursor:%p\n",(ulong)uVar5);
      ThrowString(&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  return;
}

Assistant:

void w3Module::read_section (uint8_t** cursor)
{
    uint8_t* payload = *cursor;
    const uint32_t id = read_varuint7 (cursor);

    if (id > 11)
        ThrowString (StringFormat ("malformed line:%d id:%X payload:%p base:%p end:%p", __LINE__, id, payload, base, end)); // UNDONE context

    printf ("%s(%d) read_section offset:%" FORMAT_SIZE "X\n", __FILE__, __LINE__, (long_t)(*cursor - this->base));

    const size_t payload_size = read_varuint32 (cursor);
    printf ("%s payload_size:%" FORMAT_SIZE "X\n", __func__, (long_t)payload_size);
    payload = *cursor;
    uint32_t name_size = 0;
    PCH local_name = 0;
    if (id == 0)
    {
        name_size = read_varuint32 (cursor);
        local_name = (PCH)*cursor;
        if (local_name + name_size > (PCH)end)
            ThrowString (StringFormat ("malformed %d", __LINE__)); // UNDONE context (move to module or section)
    }
    if (payload + payload_size > end)
        ThrowString (StringFormat ("malformed line:%d id:%X payload:%p payload_size:%" FORMAT_SIZE "X base:%p end:%p", __LINE__, id, payload, (long_t)payload_size, base, end)); // UNDONE context

    printf ("%s(%d) read_section offset:%" FORMAT_SIZE "X\n", __FILE__, __LINE__, (long_t)(*cursor - this->base));

    *cursor = payload + payload_size;

    if (id == 0)
    {
        if (name_size < INT_MAX)
            printf ("skipping custom section:.%.*s\n", (int)name_size, local_name);
        // UNDONE custom sections
        return;
    }

    printf("%s(%d)\n", __FILE__, __LINE__);

    w3Section& section = sections [id];
    section.id = id;
    section.name.data = local_name;
    section.name.size = name_size;
    section.payload_size = payload_size;
    section.payload = payload;

    printf("%s(%d) %d\n", __FILE__, __LINE__, (int)id);
    //DebugBreak ();

    (this->*section_traits [id].read) (&payload);

    if (payload != *cursor)
        ThrowString (StringFormat ("failed to read section:%X payload:%p cursor:%p\n", id, payload, *cursor));
}